

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O1

size_t ZSTD_decompressMultiFrame
                 (ZSTD_DCtx *dctx,void *dst,size_t dstCapacity,void *src,size_t srcSize,void *dict,
                 size_t dictSize,ZSTD_DDict *ddict)

{
  long lVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  ZSTD_ErrorCode ZVar5;
  size_t sVar6;
  void *__n;
  XXH64_hash_t XVar7;
  char cVar8;
  void *pvVar9;
  void *__n_00;
  void *pvVar10;
  void *pvVar11;
  uint *puVar12;
  void *pvVar13;
  bool bVar14;
  void *local_b0;
  size_t local_68;
  void *local_60;
  blockProperties_t local_54;
  void *local_48;
  void *local_40;
  void *local_38;
  
  local_60 = dict;
  if (ddict != (ZSTD_DDict *)0x0) {
    local_60 = ZSTD_DDict_dictContent(ddict);
    dictSize = ZSTD_DDict_dictSize(ddict);
  }
  bVar3 = 0;
  pvVar13 = dst;
  local_68 = dstCapacity;
  local_38 = dst;
  do {
    do {
      if (srcSize < (void *)0x5) {
        if ((void *)srcSize != (void *)0x0) {
          return 0xffffffffffffffb8;
        }
        return (long)pvVar13 - (long)local_38;
      }
      iVar4 = 0;
      pvVar11 = dst;
      if ((*src & 0xfffffff0) == 0x184d2a50) {
        pvVar9 = (void *)0xffffffffffffffb8;
        if ((void *)0x7 < srcSize) {
          pvVar9 = (void *)0xfffffffffffffff2;
          if (*(uint *)((long)src + 4) >> 3 < 0x1fffffff) {
            pvVar9 = (void *)((ulong)*(uint *)((long)src + 4) + 8);
          }
        }
        iVar4 = 1;
        pvVar11 = pvVar9;
        if (pvVar9 < (void *)0xffffffffffffff89) {
          if (srcSize < pvVar9) {
            pvVar11 = (void *)0xffffffffffffffb8;
          }
          else {
            src = (void *)((long)src + (long)pvVar9);
            iVar4 = 2;
            pvVar11 = dst;
            srcSize = (size_t)(srcSize - (long)pvVar9);
          }
        }
      }
      dst = pvVar11;
    } while (iVar4 == 2);
    if (iVar4 != 0) {
      return (size_t)dst;
    }
    if (ddict == (ZSTD_DDict *)0x0) {
      sVar6 = ZSTD_decompressBegin_usingDict(dctx,local_60,dictSize);
      if (0xffffffffffffff88 < sVar6) {
        return sVar6;
      }
    }
    else {
      ZSTD_decompressBegin_usingDDict(dctx,ddict);
    }
    pvVar11 = dctx->previousDstEnd;
    if (pvVar11 != pvVar13) {
      dctx->dictEnd = pvVar11;
      dctx->virtualStart = (void *)(((long)dctx->prefixStart - (long)pvVar11) + (long)pvVar13);
      dctx->prefixStart = pvVar13;
      dctx->previousDstEnd = pvVar13;
    }
    local_40 = dst;
    if (srcSize < (void *)0x9) {
      pvVar11 = (void *)0xffffffffffffffb8;
    }
    else {
      bVar2 = (byte)*(uint *)((long)src + 4);
      lVar1 = ZSTD_did_fieldSize[bVar2 & 3] +
              *(long *)((long)ZSTD_fcs_fieldSize + (ulong)(bVar2 >> 3 & 0x18)) +
              (ulong)((bVar2 & 0x20) == 0) + (ulong)(bVar2 < 0x40 & (byte)((bVar2 & 0x20) >> 5));
      pvVar10 = (void *)(lVar1 + 5);
      pvVar11 = pvVar10;
      puVar12 = (uint *)src;
      pvVar9 = (void *)srcSize;
      if (pvVar10 < (void *)0xffffffffffffff89) {
        if (srcSize < (void *)(lVar1 + 8U)) {
          pvVar11 = (void *)0xffffffffffffffb8;
          goto LAB_00514995;
        }
        pvVar11 = (void *)ZSTD_decodeFrameHeader(dctx,src,(size_t)pvVar10);
        bVar14 = pvVar11 < (void *)0xffffffffffffff89;
        if (bVar14) {
          puVar12 = (uint *)((long)src + (long)pvVar10);
          pvVar9 = (void *)(srcSize - (long)pvVar10);
        }
      }
      else {
LAB_00514995:
        bVar14 = false;
      }
      local_b0 = pvVar13;
      if (bVar14) {
        do {
          __n = (void *)ZSTD_getcBlockSize(puVar12,(size_t)pvVar9,&local_54);
          cVar8 = '\x01';
          pvVar10 = __n;
          if (__n < (void *)0xffffffffffffff89) {
            puVar12 = (uint *)((long)puVar12 + 3);
            pvVar9 = (void *)((long)pvVar9 + -3);
            if (pvVar9 < __n) {
              pvVar10 = (void *)0xffffffffffffffb8;
            }
            else {
              if (local_54.blockType == bt_raw) {
                if (local_b0 == (void *)0x0) {
                  pvVar10 = (void *)0xffffffffffffffb6;
                  if (__n == (void *)0x0) {
                    pvVar10 = __n;
                  }
                }
                else {
                  pvVar10 = (void *)0xffffffffffffffba;
                  if (__n <= (void *)((long)pvVar13 + (local_68 - (long)local_b0))) {
                    memcpy(local_b0,puVar12,(size_t)__n);
                    pvVar10 = __n;
                  }
                }
              }
              else if (local_54.blockType == bt_rle) {
                __n_00 = (void *)(ulong)local_54.origSize;
                if (local_b0 == (void *)0x0) {
                  pvVar10 = __n_00;
                  if (__n_00 != (void *)0x0) {
                    pvVar10 = (void *)0xffffffffffffffb6;
                  }
                }
                else {
                  pvVar10 = (void *)0xffffffffffffffba;
                  if (__n_00 <= (void *)((long)pvVar13 + (local_68 - (long)local_b0))) {
                    local_48 = __n_00;
                    memset(local_b0,(uint)*(byte *)puVar12,(size_t)__n_00);
                    pvVar10 = local_48;
                  }
                }
              }
              else {
                if (local_54.blockType != bt_compressed) {
                  pvVar10 = (void *)0xffffffffffffffec;
                  goto LAB_00514ba6;
                }
                pvVar10 = (void *)ZSTD_decompressBlock_internal
                                            (dctx,local_b0,
                                             (long)pvVar13 + (local_68 - (long)local_b0),puVar12,
                                             (size_t)__n,1);
              }
              cVar8 = '\x01';
              if (pvVar10 < (void *)0xffffffffffffff89) {
                if ((dctx->fParams).checksumFlag != 0) {
                  XXH64_update(&dctx->xxhState,local_b0,(size_t)pvVar10);
                }
                local_b0 = (void *)((long)local_b0 + (long)pvVar10);
                puVar12 = (uint *)((long)puVar12 + (long)__n);
                cVar8 = (local_54.lastBlock != 0) * '\x03';
                pvVar10 = pvVar11;
                pvVar9 = (void *)((long)pvVar9 - (long)__n);
              }
            }
          }
LAB_00514ba6:
          pvVar11 = pvVar10;
        } while (cVar8 == '\0');
        if (cVar8 == '\x03') {
          pvVar11 = (void *)(dctx->fParams).frameContentSize;
          if ((pvVar11 == (void *)0xffffffffffffffff) ||
             ((void *)((long)local_b0 - (long)pvVar13) == pvVar11)) {
            if ((dctx->fParams).checksumFlag != 0) {
              XVar7 = XXH64_digest(&dctx->xxhState);
              pvVar11 = (void *)0xffffffffffffffea;
              if (pvVar9 < (void *)0x4) {
                bVar14 = false;
              }
              else {
                bVar14 = *puVar12 == (uint)XVar7;
                if (bVar14) {
                  puVar12 = puVar12 + 1;
                  pvVar9 = (void *)((long)pvVar9 + -4);
                  pvVar11 = pvVar10;
                }
              }
              if (!bVar14) goto LAB_00514c04;
            }
            pvVar11 = (void *)((long)local_b0 - (long)pvVar13);
            srcSize = (size_t)pvVar9;
            src = puVar12;
          }
          else {
            pvVar11 = (void *)0xffffffffffffffec;
          }
        }
      }
    }
LAB_00514c04:
    dst = pvVar11;
    ZVar5 = ZSTD_getErrorCode((size_t)dst);
    if ((bool)(bVar3 & ZVar5 == ZSTD_error_prefix_unknown)) {
      bVar14 = false;
      dst = (void *)0xffffffffffffffb8;
    }
    else if (dst < (void *)0xffffffffffffff89) {
      pvVar13 = (void *)((long)pvVar13 + (long)dst);
      local_68 = local_68 - (long)dst;
      bVar14 = true;
      dst = local_40;
    }
    else {
      bVar14 = false;
    }
    bVar3 = 1;
    if (!bVar14) {
      return (size_t)dst;
    }
  } while( true );
}

Assistant:

static size_t ZSTD_decompressMultiFrame(ZSTD_DCtx* dctx,
                                        void* dst, size_t dstCapacity,
                                  const void* src, size_t srcSize,
                                  const void* dict, size_t dictSize,
                                  const ZSTD_DDict* ddict)
{
    void* const dststart = dst;
    int moreThan1Frame = 0;

    DEBUGLOG(5, "ZSTD_decompressMultiFrame");
    assert(dict==NULL || ddict==NULL);  /* either dict or ddict set, not both */

    if (ddict) {
        dict = ZSTD_DDict_dictContent(ddict);
        dictSize = ZSTD_DDict_dictSize(ddict);
    }

    while (srcSize >= ZSTD_FRAMEHEADERSIZE_PREFIX) {

#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT >= 1)
        if (ZSTD_isLegacy(src, srcSize)) {
            size_t decodedSize;
            size_t const frameSize = ZSTD_findFrameCompressedSizeLegacy(src, srcSize);
            if (ZSTD_isError(frameSize)) return frameSize;
            /* legacy support is not compatible with static dctx */
            if (dctx->staticSize) return ERROR(memory_allocation);

            decodedSize = ZSTD_decompressLegacy(dst, dstCapacity, src, frameSize, dict, dictSize);
            if (ZSTD_isError(decodedSize)) return decodedSize;

            assert(decodedSize <=- dstCapacity);
            dst = (BYTE*)dst + decodedSize;
            dstCapacity -= decodedSize;

            src = (const BYTE*)src + frameSize;
            srcSize -= frameSize;

            continue;
        }
#endif

        {   U32 const magicNumber = MEM_readLE32(src);
            DEBUGLOG(4, "reading magic number %08X (expecting %08X)",
                        (unsigned)magicNumber, ZSTD_MAGICNUMBER);
            if ((magicNumber & ZSTD_MAGIC_SKIPPABLE_MASK) == ZSTD_MAGIC_SKIPPABLE_START) {
                size_t const skippableSize = readSkippableFrameSize(src, srcSize);
                if (ZSTD_isError(skippableSize))
                    return skippableSize;
                if (srcSize < skippableSize) return ERROR(srcSize_wrong);

                src = (const BYTE *)src + skippableSize;
                srcSize -= skippableSize;
                continue;
        }   }

        if (ddict) {
            /* we were called from ZSTD_decompress_usingDDict */
            CHECK_F(ZSTD_decompressBegin_usingDDict(dctx, ddict));
        } else {
            /* this will initialize correctly with no dict if dict == NULL, so
             * use this in all cases but ddict */
            CHECK_F(ZSTD_decompressBegin_usingDict(dctx, dict, dictSize));
        }
        ZSTD_checkContinuity(dctx, dst);

        {   const size_t res = ZSTD_decompressFrame(dctx, dst, dstCapacity,
                                                    &src, &srcSize);
            if ( (ZSTD_getErrorCode(res) == ZSTD_error_prefix_unknown)
              && (moreThan1Frame==1) ) {
                /* at least one frame successfully completed,
                 * but following bytes are garbage :
                 * it's more likely to be a srcSize error,
                 * specifying more bytes than compressed size of frame(s).
                 * This error message replaces ERROR(prefix_unknown),
                 * which would be confusing, as the first header is actually correct.
                 * Note that one could be unlucky, it might be a corruption error instead,
                 * happening right at the place where we expect zstd magic bytes.
                 * But this is _much_ less likely than a srcSize field error. */
                return ERROR(srcSize_wrong);
            }
            if (ZSTD_isError(res)) return res;
            assert(res <= dstCapacity);
            dst = (BYTE*)dst + res;
            dstCapacity -= res;
        }
        moreThan1Frame = 1;
    }  /* while (srcSize >= ZSTD_frameHeaderSize_prefix) */

    if (srcSize) return ERROR(srcSize_wrong); /* input not entirely consumed */

    return (BYTE*)dst - (BYTE*)dststart;
}